

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwaitcondition_unix.cpp
# Opt level: O2

__pid_t __thiscall QWaitCondition::wait(QWaitCondition *this,void *__stat_loc)

{
  int *piVar1;
  int code;
  __pid_t _Var2;
  void *in_RDX;
  
  if (__stat_loc != (void *)0x0) {
    code = pthread_mutex_lock((pthread_mutex_t *)this->d);
    qt_report_pthread_error(code,"QWaitCondition::wait()","mutex lock");
    piVar1 = &this->d->waiters;
    *piVar1 = *piVar1 + 1;
    QBasicMutex::unlock((QBasicMutex *)__stat_loc);
    _Var2 = QWaitConditionPrivate::wait(this->d,in_RDX);
    QBasicMutex::lock((QBasicMutex *)__stat_loc);
    return _Var2;
  }
  return 0;
}

Assistant:

bool QWaitCondition::wait(QMutex *mutex, QDeadlineTimer deadline)
{
    if (!mutex)
        return false;

    qt_report_pthread_error(pthread_mutex_lock(&d->mutex), "QWaitCondition::wait()", "mutex lock");
    ++d->waiters;
    mutex->unlock();

    bool returnValue = d->wait(deadline);

    mutex->lock();

    return returnValue;
}